

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RowSetEntry * rowSetNDeepTree(RowSetEntry **ppList,int iDepth)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  int in_ESI;
  long *in_RDI;
  RowSetEntry *pLeft;
  RowSetEntry *p;
  undefined4 in_stack_ffffffffffffffe8;
  RowSetEntry *local_8;
  
  if (*in_RDI == 0) {
    local_8 = (RowSetEntry *)0x0;
  }
  else if (in_ESI < 2) {
    local_8 = (RowSetEntry *)*in_RDI;
    *in_RDI = (long)local_8->pRight;
    local_8->pRight = (RowSetEntry *)0x0;
    local_8->pLeft = (RowSetEntry *)0x0;
  }
  else {
    local_8 = rowSetNDeepTree((RowSetEntry **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),-0x55555556
                             );
    pRVar1 = (RowSetEntry *)*in_RDI;
    if (pRVar1 != (RowSetEntry *)0x0) {
      pRVar1->pLeft = local_8;
      *in_RDI = (long)pRVar1->pRight;
      pRVar2 = rowSetNDeepTree((RowSetEntry **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                               (int)((ulong)pRVar1 >> 0x20));
      pRVar1->pRight = pRVar2;
      local_8 = pRVar1;
    }
  }
  return local_8;
}

Assistant:

static struct RowSetEntry *rowSetNDeepTree(
  struct RowSetEntry **ppList,
  int iDepth
){
  struct RowSetEntry *p;         /* Root of the new tree */
  struct RowSetEntry *pLeft;     /* Left subtree */
  if( *ppList==0 ){ /*OPTIMIZATION-IF-TRUE*/
    /* Prevent unnecessary deep recursion when we run out of entries */
    return 0;
  }
  if( iDepth>1 ){   /*OPTIMIZATION-IF-TRUE*/
    /* This branch causes a *balanced* tree to be generated.  A valid tree
    ** is still generated without this branch, but the tree is wildly
    ** unbalanced and inefficient. */
    pLeft = rowSetNDeepTree(ppList, iDepth-1);
    p = *ppList;
    if( p==0 ){     /*OPTIMIZATION-IF-FALSE*/
      /* It is safe to always return here, but the resulting tree
      ** would be unbalanced */
      return pLeft;
    }
    p->pLeft = pLeft;
    *ppList = p->pRight;
    p->pRight = rowSetNDeepTree(ppList, iDepth-1);
  }else{
    p = *ppList;
    *ppList = p->pRight;
    p->pLeft = p->pRight = 0;
  }
  return p;
}